

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void AnalyzeClassBaseElements
               (ExpressionContext *ctx,ExprClassDefinition *classDefinition,SynClassElements *syntax
               )

{
  TypeClass *pTVar1;
  ExprBase *pEVar2;
  VariableData *pVVar3;
  int iVar4;
  ExprAliasDefinition *pEVar5;
  undefined4 extraout_var;
  ExprVariableDefinitions *pEVar6;
  MemberHandle *node;
  TypeBase *type;
  SynBase *pSVar7;
  SynVariableDefinitions *syntax_00;
  SynConstant *in_R8;
  SynTypedef *syntax_01;
  SynConstantSet *source;
  IntrusiveList<ExprBase> *pIVar8;
  SynClassStaticIf *syntax_02;
  IntrusiveList<SynConstant> constants;
  undefined4 extraout_var_00;
  
  syntax_01 = (syntax->typedefs).head;
  while (syntax_01 != (SynTypedef *)0x0) {
    pEVar5 = AnalyzeTypedef(ctx,syntax_01);
    pTVar1 = classDefinition->classType;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    MatchData::MatchData
              ((MatchData *)CONCAT44(extraout_var,iVar4),pEVar5->alias->name,pEVar5->alias->type);
    IntrusiveList<MatchData>::push_back(&pTVar1->aliases,(MatchData *)CONCAT44(extraout_var,iVar4));
    syntax_01 = (SynTypedef *)(syntax_01->super_SynBase).next;
    if ((syntax_01 == (SynTypedef *)0x0) || ((syntax_01->super_SynBase).typeID != 0x16)) {
      syntax_01 = (SynTypedef *)0x0;
    }
  }
  syntax_00 = (syntax->members).head;
  do {
    if (syntax_00 == (SynVariableDefinitions *)0x0) {
      source = (syntax->constantSets).head;
      while (source != (SynConstantSet *)0x0) {
        type = AnalyzeType(ctx,source->type,true,(bool *)0x0);
        constants.tail = in_R8;
        constants.head = (source->constants).head;
        AnalyzeClassConstants
                  (ctx,&source->super_SynBase,type,constants,
                   &(classDefinition->classType->super_TypeStruct).constants);
        source = (SynConstantSet *)(source->super_SynBase).next;
        if ((source == (SynConstantSet *)0x0) || ((source->super_SynBase).typeID != 0x3b)) {
          source = (SynConstantSet *)0x0;
        }
      }
      syntax_02 = (syntax->staticIfs).head;
      while (syntax_02 != (SynClassStaticIf *)0x0) {
        AnalyzeClassStaticIf(ctx,classDefinition,syntax_02,true);
        syntax_02 = (SynClassStaticIf *)(syntax_02->super_SynBase).next;
        if ((syntax_02 == (SynClassStaticIf *)0x0) || ((syntax_02->super_SynBase).typeID != 0x3d)) {
          syntax_02 = (SynClassStaticIf *)0x0;
        }
      }
      return;
    }
    pEVar6 = AnalyzeVariableDefinitions(ctx,syntax_00);
    pIVar8 = &pEVar6->definitions;
    while (pEVar2 = pIVar8->head, pEVar2 != (ExprBase *)0x0) {
      if ((pEVar2->type == (TypeBase *)0x0) || (pEVar2->type->typeID != 0)) {
        if (pEVar2->typeID != 0x1e) {
          __assert_fail("variableDefinition",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x28f9,
                        "void AnalyzeClassBaseElements(ExpressionContext &, ExprClassDefinition *, SynClassElements *)"
                       );
        }
        pSVar7 = pEVar2->source;
        if ((pSVar7 == (SynBase *)0x0) || (pSVar7->typeID != 0x33)) {
          pSVar7 = (SynBase *)0x0;
        }
        pTVar1 = classDefinition->classType;
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
        node = (MemberHandle *)CONCAT44(extraout_var_00,iVar4);
        if (pSVar7 == (SynBase *)0x0) {
          pSVar7 = (SynBase *)0x0;
        }
        else {
          pSVar7 = *(SynBase **)&pSVar7[1].typeID;
        }
        pVVar3 = (VariableData *)pEVar2[1]._vptr_ExprBase[1];
        node->source = (SynBase *)*pEVar2[1]._vptr_ExprBase;
        node->variable = pVVar3;
        node->initializer = pSVar7;
        node->next = (MemberHandle *)0x0;
        node->listed = false;
        IntrusiveList<MemberHandle>::push_back(&(pTVar1->super_TypeStruct).members,node);
      }
      pIVar8 = (IntrusiveList<ExprBase> *)&pEVar2->next;
    }
    syntax_00 = (SynVariableDefinitions *)(syntax_00->super_SynBase).next;
    if ((syntax_00 == (SynVariableDefinitions *)0x0) || ((syntax_00->super_SynBase).typeID != 0x34))
    {
      syntax_00 = (SynVariableDefinitions *)0x0;
    }
  } while( true );
}

Assistant:

void AnalyzeClassBaseElements(ExpressionContext &ctx, ExprClassDefinition *classDefinition, SynClassElements *syntax)
{
	for(SynTypedef *typeDef = syntax->typedefs.head; typeDef; typeDef = getType<SynTypedef>(typeDef->next))
	{
		ExprAliasDefinition *alias = AnalyzeTypedef(ctx, typeDef);

		classDefinition->classType->aliases.push_back(new (ctx.get<MatchData>()) MatchData(alias->alias->name, alias->alias->type));
	}

	{
		for(SynVariableDefinitions *member = syntax->members.head; member; member = getType<SynVariableDefinitions>(member->next))
		{
			ExprVariableDefinitions *node = AnalyzeVariableDefinitions(ctx, member);

			for(ExprBase *definition = node->definitions.head; definition; definition = definition->next)
			{
				if(isType<TypeError>(definition->type))
					continue;

				ExprVariableDefinition *variableDefinition = getType<ExprVariableDefinition>(definition);

				assert(variableDefinition);

				SynVariableDefinition *sourceDefinition = getType<SynVariableDefinition>(definition->source);

				classDefinition->classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(variableDefinition->variable->source, variableDefinition->variable->variable, sourceDefinition ? sourceDefinition->initializer : NULL));
			}
		}
	}

	for(SynConstantSet *constantSet = syntax->constantSets.head; constantSet; constantSet = getType<SynConstantSet>(constantSet->next))
	{
		TypeBase *type = AnalyzeType(ctx, constantSet->type);

		AnalyzeClassConstants(ctx, constantSet, type, constantSet->constants, classDefinition->classType->constants);
	}

	// TODO: The way SynClassElements is made, it could allow member re-ordering! class should contain in-order members and static if's
	// TODO: We should be able to analyze all static if typedefs before members and constants and analyze them before functions
	for(SynClassStaticIf *staticIf = syntax->staticIfs.head; staticIf; staticIf = getType<SynClassStaticIf>(staticIf->next))
		AnalyzeClassStaticIf(ctx, classDefinition, staticIf, true);
}